

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O1

ZyanStatus ZydisFormatterBufferRemember(ZydisFormatterBuffer *buffer,ZyanUPointer *state)

{
  ZyanStatus ZVar1;
  void *pvVar2;
  
  ZVar1 = 0x80100004;
  if (state != (ZyanUPointer *)0x0 && buffer != (ZydisFormatterBuffer *)0x0) {
    if (buffer->is_token_list == '\0') {
      pvVar2 = (void *)(buffer->string).vector.size;
    }
    else {
      pvVar2 = (buffer->string).vector.data;
    }
    *state = (ZyanUPointer)pvVar2;
    ZVar1 = 0x100000;
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterBufferRemember(const ZydisFormatterBuffer* buffer, ZyanUPointer* state)
{
    if (!buffer || !state)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (buffer->is_token_list)
    {
        *state = (ZyanUPointer)buffer->string.vector.data;
    } else
    {
        *state = (ZyanUPointer)buffer->string.vector.size;
    }

    return ZYAN_STATUS_SUCCESS;
}